

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmbedTexturesProcess.cpp
# Opt level: O0

void __thiscall Assimp::EmbedTexturesProcess::~EmbedTexturesProcess(EmbedTexturesProcess *this)

{
  EmbedTexturesProcess *this_local;
  
  (this->super_BaseProcess)._vptr_BaseProcess = (_func_int **)&PTR__EmbedTexturesProcess_00dfd118;
  std::__cxx11::string::~string((string *)&this->mRootPath);
  BaseProcess::~BaseProcess(&this->super_BaseProcess);
  return;
}

Assistant:

EmbedTexturesProcess::~EmbedTexturesProcess() {
}